

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_ru_u_access<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>
               (void)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  node_ptr plVar4;
  node_ptr plVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  pointer pvVar18;
  pool<boost::default_user_allocator_malloc_free> *ppVar19;
  _Base_ptr p_Var20;
  pointer p;
  _Hash_node_base *p_Var21;
  ulong uVar22;
  pointer p_1;
  pointer p_00;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  uColumns;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>
  m;
  shared_count sStack_4b0;
  char *local_4a8;
  _Base_ptr local_4a0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_498;
  undefined **local_478;
  undefined1 local_470;
  _Base_ptr local_468;
  _Base_ptr local_460;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_448;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  pool<boost::default_user_allocator_malloc_free> *local_310;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
  local_308;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>>
            ();
  local_310 = (pool<boost::default_user_allocator_malloc_free> *)operator_new(0x38);
  (((Entry_constructor *)&local_310->super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (local_310->list).ptr = (char *)0x0;
  (local_310->list).sz = 0;
  local_310->requested_size = 0x18;
  local_310->next_size = 0x20;
  local_310->start_size = 0x20;
  local_310->max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>
              *)&local_308,&local_448,(Column_settings *)local_310);
  local_498.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_498.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_498.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var20 = (_Base_ptr)operator_new(0xa8);
  local_498.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var20;
  local_498.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&p_Var20[5]._M_parent;
  memset(p_Var20,0,0xa8);
  local_478._0_4_ = 0;
  local_498.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&p_Var20[5]._M_parent;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)p_Var20,&local_478);
  local_478._0_4_ = 1;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             ((long)local_498.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x18),&local_478);
  local_478 = (undefined **)CONCAT44(local_478._4_4_,2);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             &((_Base_ptr)
              ((long)local_498.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x20))->_M_left,&local_478);
  local_478 = (undefined **)0x500000003;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             &((_Base_ptr)
              ((long)local_498.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x40))->_M_parent,&local_478);
  local_478 = (undefined **)0x500000004;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             ((long)local_498.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x60),&local_478);
  local_478._0_4_ = 5;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             &((_Base_ptr)
              ((long)local_498.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x60))->_M_right,&local_478);
  local_478 = (undefined **)CONCAT44(local_478._4_4_,6);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)
             &((_Base_ptr)
              ((long)local_498.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x80))->_M_left,&local_478);
  pvVar18 = local_498.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_498.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_498.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar22 = 0;
    p_Var20 = (_Base_ptr)
              local_498.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (local_308.mirrorMatrixU_.
          super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_true,_true>_>_>_>
          .rowSwapped_ == true) {
        Gudhi::persistence_matrix::
        Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>
        ::_orderRows(&local_308.mirrorMatrixU_.
                      super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_true,_true>_>_>_>
                    );
      }
      if (local_308.mirrorMatrixU_.matrix_._M_h._M_buckets
          [uVar22 % local_308.mirrorMatrixU_.matrix_._M_h._M_bucket_count] == (__node_base_ptr)0x0)
      {
LAB_0018c4df:
        std::__throw_out_of_range("_Map_base::at");
      }
      p_Var2 = local_308.mirrorMatrixU_.matrix_._M_h._M_buckets
               [uVar22 % local_308.mirrorMatrixU_.matrix_._M_h._M_bucket_count]->_M_nxt;
      uVar1 = *(uint *)&p_Var2[1]._M_nxt;
      while ((uint)uVar22 != uVar1) {
        p_Var2 = p_Var2->_M_nxt;
        if ((p_Var2 == (_Hash_node_base *)0x0) ||
           (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
           (ulong)uVar1 % local_308.mirrorMatrixU_.matrix_._M_h._M_bucket_count !=
           uVar22 % local_308.mirrorMatrixU_.matrix_._M_h._M_bucket_count)) goto LAB_0018c4df;
      }
      get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>>
                ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>
                  *)&local_478,
                 (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
                  *)(p_Var2 + 2));
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>>
                ((witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>
                  *)p_Var20,
                 (column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>
                  *)&local_478);
      uVar22 = (ulong)((uint)uVar22 + 1);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&local_478);
      p_Var20 = (_Base_ptr)&p_Var20->_M_right;
    } while (p_Var20 != (_Base_ptr)pvVar18);
  }
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_320,0x296);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_308.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
  uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar6,0);
  if (local_308.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff] != (__node_base_ptr)0x0)
  {
    p_Var2 = local_308.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    while (uVar1 != 3) {
      p_Var2 = p_Var2->_M_nxt;
      if ((p_Var2 == (_Hash_node_base *)0x0) ||
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
         (ulong)uVar1 % local_308.mirrorMatrixU_.matrix_._M_h._M_bucket_count != uVar22))
      goto LAB_0018c4f7;
    }
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_308.mirrorMatrixU_.
                   super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_true,_true>_>_>_>
                   .indexToRow_._M_h._M_bucket_count;
    uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar7,0);
    if (local_308.mirrorMatrixU_.
        super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_true,_true>_>_>_>
        .indexToRow_._M_h._M_buckets[uVar22 & 0xffffffff] != (__node_base_ptr)0x0) {
      p_Var3 = local_308.mirrorMatrixU_.
               super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_true,_true>_>_>_>
               .indexToRow_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x0018bbec;
    }
  }
  goto LAB_0018c4f7;
joined_r0x0018be0c:
  if (uVar1 == 3) {
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         local_308.mirrorMatrixU_.
         super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_true,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count;
    uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar10,0);
    if (local_308.mirrorMatrixU_.
        super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_true,_true>_>_>_>
        .indexToRow_._M_h._M_buckets[uVar22 & 0xffffffff] != (__node_base_ptr)0x0) {
      p_Var3 = local_308.mirrorMatrixU_.
               super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_true,_true>_>_>_>
               .indexToRow_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x0018be67;
    }
    goto LAB_0018c4eb;
  }
  p_Var2 = p_Var2->_M_nxt;
  if ((p_Var2 == (_Hash_node_base *)0x0) ||
     (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
     (ulong)uVar1 % local_308.mirrorMatrixU_.matrix_._M_h._M_bucket_count != uVar22))
  goto LAB_0018c4eb;
  goto joined_r0x0018be0c;
  while ((p_Var3 = p_Var3->_M_nxt, p_Var3 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
         (ulong)uVar1 %
         local_308.mirrorMatrixU_.
         super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_true,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count == uVar22))) {
joined_r0x0018be67:
    if (uVar1 == 5) {
      p_00 = (pointer)(p_Var2 + 5);
      goto LAB_0018be9a;
    }
  }
  goto LAB_0018c4eb;
  while( true ) {
    if (p_00 == (pointer)0x0) goto LAB_0018c51b;
    if (p_00->rowIndex_ == *(ID_index *)((long)&p_Var3[1]._M_nxt + 4)) break;
LAB_0018be9a:
    p_00 = (pointer)(p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
    if (p_00 == (pointer)(p_Var2 + 5)) goto LAB_0018becd;
  }
  plVar4 = (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
  plVar5 = (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_;
  plVar5->next_ = plVar4;
  plVar4->prev_ = plVar5;
  (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  Gudhi::
  Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>
  ::destroy((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>
             *)p_Var2[4]._M_nxt,p_00);
LAB_0018becd:
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_380,0x299);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_308.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
  uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar11,0);
  if (local_308.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff] != (__node_base_ptr)0x0)
  {
    p_Var2 = local_308.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    while (uVar1 != 3) {
      p_Var2 = p_Var2->_M_nxt;
      if ((p_Var2 == (_Hash_node_base *)0x0) ||
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
         (ulong)uVar1 % local_308.mirrorMatrixU_.matrix_._M_h._M_bucket_count != uVar22))
      goto LAB_0018c503;
    }
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         local_308.mirrorMatrixU_.
         super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_true,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count;
    uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar12,0);
    if (local_308.mirrorMatrixU_.
        super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_true,_true>_>_>_>
        .indexToRow_._M_h._M_buckets[uVar22 & 0xffffffff] != (__node_base_ptr)0x0) {
      p_Var3 = local_308.mirrorMatrixU_.
               super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_true,_true>_>_>_>
               .indexToRow_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x0018bf8a;
    }
  }
  goto LAB_0018c503;
joined_r0x0018c23d:
  if (uVar1 == 3) {
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         local_308.mirrorMatrixU_.
         super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_true,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count;
    uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar16,0);
    if (local_308.mirrorMatrixU_.
        super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_true,_true>_>_>_>
        .indexToRow_._M_h._M_buckets[uVar22 & 0xffffffff] != (__node_base_ptr)0x0) {
      p_Var3 = local_308.mirrorMatrixU_.
               super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_true,_true>_>_>_>
               .indexToRow_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x0018c298;
    }
    goto LAB_0018c50f;
  }
  p_Var2 = p_Var2->_M_nxt;
  if ((p_Var2 == (_Hash_node_base *)0x0) ||
     (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
     (ulong)uVar1 % local_308.mirrorMatrixU_.matrix_._M_h._M_bucket_count != uVar22))
  goto LAB_0018c50f;
  goto joined_r0x0018c23d;
joined_r0x0018c298:
  if (uVar1 == 5) {
    p_Var21 = p_Var2 + 5;
    goto LAB_0018c2cb;
  }
  p_Var3 = p_Var3->_M_nxt;
  if ((p_Var3 == (_Hash_node_base *)0x0) ||
     (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
     (ulong)uVar1 %
     local_308.mirrorMatrixU_.
     super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_true,_true>_>_>_>
     .indexToRow_._M_h._M_bucket_count != uVar22)) {
LAB_0018c50f:
    std::__throw_out_of_range("_Map_base::at");
  }
  goto joined_r0x0018c298;
  while( true ) {
    if (p_Var21 == (_Hash_node_base *)0x0) goto LAB_0018c51b;
    if (*(int *)&p_Var21[2]._M_nxt == *(int *)((long)&p_Var3[1]._M_nxt + 4)) break;
LAB_0018bc1f:
    p_Var21 = p_Var21->_M_nxt;
    if (p_Var21 == p_Var2 + 5) break;
  }
  sStack_4b0.pi_ = (sp_counted_base *)0x0;
  local_4a8 = "!m.is_zero_entry(3, 5, false)";
  local_4a0 = (_Base_ptr)0x1f66bf;
  local_470 = _S_red;
  local_478 = &PTR__lazy_ostream_00239378;
  local_468 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_338 = "";
  local_460 = (_Base_ptr)&local_4a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b0);
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_350,0x297);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_308.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
  uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar8,0);
  if (local_308.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff] != (__node_base_ptr)0x0)
  {
    p_Var2 = local_308.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 4) {
        sStack_4b0.pi_ = (sp_counted_base *)0x0;
        local_4a8 = "!m.is_zero_column(4, false)";
        local_4a0 = (_Base_ptr)0x1f66db;
        local_470 = _S_red;
        local_478 = &PTR__lazy_ostream_00239378;
        local_468 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_370 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_368 = "";
        local_460 = (_Base_ptr)&local_4a8;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_4b0);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = local_308.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
        uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar9,0);
        if (local_308.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff] ==
            (__node_base_ptr)0x0) goto LAB_0018c4eb;
        p_Var2 = local_308.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x0018be0c;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_308.mirrorMatrixU_.matrix_._M_h._M_bucket_count == uVar22));
  }
  std::__throw_out_of_range("_Map_base::at");
  while( true ) {
    if (p_Var21 == (_Hash_node_base *)0x0) goto LAB_0018c51b;
    if (*(int *)&p_Var21[2]._M_nxt == *(int *)((long)&p_Var3[1]._M_nxt + 4)) break;
LAB_0018bfbd:
    p_Var21 = p_Var21->_M_nxt;
    if (p_Var21 == p_Var2 + 5) break;
  }
  sStack_4b0.pi_ = (sp_counted_base *)0x0;
  local_4a8 = "m.is_zero_entry(3, 5, false)";
  local_4a0 = (_Base_ptr)0x1f66bf;
  local_470 = _S_red;
  local_478 = &PTR__lazy_ostream_00239378;
  local_468 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_398 = "";
  local_460 = (_Base_ptr)&local_4a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b0);
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3b0,0x29a);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_308.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
  uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar13,0);
  if (local_308.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff] != (__node_base_ptr)0x0)
  {
    p_Var2 = local_308.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 4) {
        sStack_4b0.pi_ = (sp_counted_base *)0x0;
        local_4a8 = "!m.is_zero_column(4, false)";
        local_4a0 = (_Base_ptr)0x1f66db;
        local_470 = _S_red;
        local_478 = &PTR__lazy_ostream_00239378;
        local_468 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_3d0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_3c8 = "";
        local_460 = (_Base_ptr)&local_4a8;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_4b0);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = local_308.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
        uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar14,0);
        if (local_308.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff] ==
            (__node_base_ptr)0x0) goto LAB_0018c4eb;
        p_Var2 = local_308.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x0018c1a7;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_308.mirrorMatrixU_.matrix_._M_h._M_bucket_count == uVar22));
  }
  std::__throw_out_of_range("_Map_base::at");
LAB_0018c2cb:
  do {
    p_Var21 = p_Var21->_M_nxt;
    if (p_Var21 == p_Var2 + 5) break;
    if (p_Var21 == (_Hash_node_base *)0x0) {
LAB_0018c51b:
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true, true, true>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true, true, true>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true, true, true>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true, true, true>>::Matrix_column_tag, Type = 1]"
                   );
    }
  } while (*(int *)&p_Var21[2]._M_nxt != *(int *)((long)&p_Var3[1]._M_nxt + 4));
  sStack_4b0.pi_ = (sp_counted_base *)0x0;
  local_4a8 = "m.is_zero_entry(3, 5, false)";
  local_4a0 = (_Base_ptr)0x1f66bf;
  local_470 = _S_red;
  local_478 = &PTR__lazy_ostream_00239378;
  local_468 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3f8 = "";
  local_460 = (_Base_ptr)&local_4a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b0);
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_410,0x29d);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_308.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
  uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar17,0);
  if (local_308.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff] != (__node_base_ptr)0x0)
  {
    p_Var2 = local_308.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 4) {
        sStack_4b0.pi_ = (sp_counted_base *)0x0;
        local_4a8 = "m.is_zero_column(4, false)";
        local_4a0 = (_Base_ptr)0x1f66db;
        local_470 = _S_red;
        local_478 = &PTR__lazy_ostream_00239378;
        local_468 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_430 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_428 = "";
        local_460 = (_Base_ptr)&local_4a8;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_4b0);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&local_498);
        Gudhi::persistence_matrix::
        RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
        ::reset(&local_308,(Column_settings *)local_310);
        ppVar19 = local_310;
        if (local_310 != (pool<boost::default_user_allocator_malloc_free> *)0x0) {
          boost::pool<boost::default_user_allocator_malloc_free>::purge_memory(local_310);
        }
        operator_delete(ppVar19,0x38);
        Gudhi::persistence_matrix::
        RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
        ::~RU_matrix(&local_308);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&local_448);
        return;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % local_308.mirrorMatrixU_.matrix_._M_h._M_bucket_count == uVar22));
  }
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var3 = p_Var3->_M_nxt, p_Var3 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
         (ulong)uVar1 %
         local_308.mirrorMatrixU_.
         super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_true,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count == uVar22))) {
joined_r0x0018bf8a:
    if (uVar1 == 5) {
      p_Var21 = p_Var2 + 5;
      goto LAB_0018bfbd;
    }
  }
LAB_0018c503:
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var2 = p_Var2->_M_nxt, p_Var2 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
         (ulong)uVar1 % local_308.mirrorMatrixU_.matrix_._M_h._M_bucket_count == uVar22))) {
joined_r0x0018c1a7:
    if (uVar1 == 4) {
      boost::intrusive::
      list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
      ::
      clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>::Delete_disposer>
                ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                  *)(p_Var2 + 5),
                 (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
                  *)(p_Var2 + 2));
      local_3e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_3d8 = "";
      local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3e0,0x29c);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_308.mirrorMatrixU_.matrix_._M_h._M_bucket_count;
      uVar22 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar15,0);
      if (local_308.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff] ==
          (__node_base_ptr)0x0) goto LAB_0018c50f;
      p_Var2 = local_308.mirrorMatrixU_.matrix_._M_h._M_buckets[uVar22 & 0xffffffff]->_M_nxt;
      uVar1 = *(uint *)&p_Var2[1]._M_nxt;
      goto joined_r0x0018c23d;
    }
  }
LAB_0018c4eb:
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var3 = p_Var3->_M_nxt, p_Var3 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
         (ulong)uVar1 %
         local_308.mirrorMatrixU_.
         super_template_Base_swap_option<Base_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_true,_true,_true,_true>_>_>_>
         .indexToRow_._M_h._M_bucket_count == uVar22))) {
joined_r0x0018bbec:
    if (uVar1 == 5) {
      p_Var21 = p_Var2 + 5;
      goto LAB_0018bc1f;
    }
  }
LAB_0018c4f7:
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_ru_u_access() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(orderedBoundaries, 5);

  std::vector<witness_content<typename Matrix::Column> > uColumns(7);
  if constexpr (Matrix::Option_list::is_z2) {
    uColumns[0] = {0};
    uColumns[1] = {1};
    uColumns[2] = {2};
    uColumns[3] = {3, 5};
    uColumns[4] = {4, 5};
    uColumns[5] = {5};
    uColumns[6] = {6};
  } else {
    uColumns[0] = {{0, 1}};
    uColumns[1] = {{1, 1}};
    uColumns[2] = {{2, 1}};
    uColumns[3] = {{3, 1}};
    uColumns[4] = {{4, 1}};
    uColumns[5] = {{3, 4}, {4, 4}, {5, 1}};
    uColumns[6] = {{6, 1}};
  }

  unsigned int i = 0;
  for (auto& c : uColumns) {
    const auto& col = m.get_column(i++, false);  // to force the const version
    test_column_equality<typename Matrix::Column>(c, get_column_content_via_iterators(col));
  }

  if constexpr (Matrix::Option_list::is_z2) {
    BOOST_CHECK(!m.is_zero_entry(3, 5, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_entry(3, 5, false);
    BOOST_CHECK(m.is_zero_entry(3, 5, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_column(4, false);
    BOOST_CHECK(m.is_zero_entry(3, 5, false));
    BOOST_CHECK(m.is_zero_column(4, false));
  } else {
    BOOST_CHECK(!m.is_zero_entry(5, 3, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_entry(5, 3, false);
    BOOST_CHECK(m.is_zero_entry(5, 3, false));
    BOOST_CHECK(!m.is_zero_column(4, false));
    m.zero_column(4, false);
    BOOST_CHECK(m.is_zero_entry(5, 3, false));
    BOOST_CHECK(m.is_zero_column(4, false));
  }
}